

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O0

void __thiscall Storage::Disk::Drive::set_motor_on(Drive *this,bool motor_is_on)

{
  bool bVar1;
  IntType l;
  WrappedInt<Cycles> local_38;
  Cycles local_30;
  WrappedInt<Cycles> local_28;
  WrappedInt<Cycles> local_20;
  undefined1 local_11;
  Drive *pDStack_10;
  bool motor_is_on_local;
  Drive *this_local;
  
  if ((bool)(this->motor_input_is_on_ & 1U) != motor_is_on) {
    this->motor_input_is_on_ = motor_is_on;
    local_11 = motor_is_on;
    pDStack_10 = this;
    if ((bool)(this->disk_is_rotating_ & 1U) == motor_is_on) {
      Cycles::Cycles((Cycles *)&local_20,0);
      (this->time_until_motor_transition).super_WrappedInt<Cycles>.length_ = local_20.length_;
    }
    else if (motor_is_on) {
      set_disk_is_rotating(this,true);
      Cycles::Cycles((Cycles *)&local_28,0);
      (this->time_until_motor_transition).super_WrappedInt<Cycles>.length_ = local_28.length_;
    }
    else {
      Cycles::Cycles(&local_30,0);
      bVar1 = WrappedInt<Cycles>::operator==
                        (&(this->time_until_motor_transition).super_WrappedInt<Cycles>,&local_30);
      if (bVar1) {
        l = TimedEventLoop::get_input_clock_rate(&this->super_TimedEventLoop);
        Cycles::Cycles((Cycles *)&local_38,l);
        (this->time_until_motor_transition).super_WrappedInt<Cycles>.length_ = local_38.length_;
      }
    }
  }
  return;
}

Assistant:

void Drive::set_motor_on(bool motor_is_on) {
	// Do nothing if the input hasn't changed.
	if(motor_input_is_on_ == motor_is_on) return;
	motor_input_is_on_ = motor_is_on;

	// If this now means that the input and the actual state are in harmony,
	// cancel any planned change and stop.
	if(disk_is_rotating_ == motor_is_on) {
		time_until_motor_transition = Cycles(0);
		return;
	}

	// If this is a transition to on, start immediately.
	// TODO: spin-up?
	// TODO: momentum.
	if(motor_is_on) {
		set_disk_is_rotating(true);
		time_until_motor_transition = Cycles(0);
		return;
	}

	// This is a transition from on to off. Simulate momentum (ha!)
	// by delaying the time until complete standstill.
	if(time_until_motor_transition == Cycles(0))
		time_until_motor_transition = get_input_clock_rate();
}